

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool isItAFunction<ThreeWiseHash<unsigned_int,unsigned_char>>(uint L)

{
  uchar uVar1;
  uint uVar2;
  uint32 uVar3;
  ostream *poVar4;
  ulong uVar5;
  _Elt_pointer puVar6;
  uchar *puVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  ulong uVar9;
  undefined4 uVar10;
  uchar inchar;
  uint j;
  int iVar11;
  uchar *puVar12;
  long lVar13;
  uint uVar14;
  _Map_pointer ppuVar15;
  bool bVar16;
  uchar c;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  mersenneRNG generator;
  uchar local_18a1;
  uint32 local_18a0;
  _Deque_base<unsigned_char,_std::allocator<unsigned_char>_> local_1898;
  undefined4 local_1844;
  ThreeWiseHash<unsigned_int,_unsigned_char> local_1840;
  MTRand local_13c8;
  int local_38;
  
  MTRand::seed(&local_13c8);
  local_38 = 5;
  iVar11 = 3;
  ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&local_1840,3,L);
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_last = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_cur = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_first = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_initialize_map(&local_1898,0);
  do {
    local_18a0 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_18a0);
    local_18a1 = (char)uVar3 + 'A';
    if (local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1898._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::
      _M_push_back_aux<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&local_1898,&local_18a1);
    }
    else {
      *local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur = local_18a1;
      local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    ThreeWiseHash<unsigned_int,_unsigned_char>::eat(&local_1840,local_18a1);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  uVar8 = 0;
  uVar14 = 0;
  while( true ) {
    uVar1 = *local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1844 = (undefined4)uVar8;
    if (local_1898._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_1898._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
      local_1898._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_1898._M_impl.super__Deque_impl_data._M_start._M_last =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_1898._M_impl.super__Deque_impl_data._M_start._M_first =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_1898._M_impl.super__Deque_impl_data._M_start._M_node =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_1898._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    local_18a0 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_18a0);
    inchar = (char)uVar3 + 'A';
    local_18a0 = CONCAT71(local_18a0._1_7_,inchar);
    if (local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1898._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_push_back_aux<unsigned_char>
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1898,
                 (uchar *)&local_18a0);
    }
    else {
      *local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur = inchar;
      local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    ThreeWiseHash<unsigned_int,_unsigned_char>::update(&local_1840,uVar1,inchar);
    uVar2 = ThreeWiseHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((ThreeWiseHash<unsigned_int,unsigned_char> *)&local_1840,
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1898);
    if (uVar2 != local_1840.hashvalue) break;
    bVar16 = 0x1869e < uVar14;
    uVar14 = uVar14 + 1;
    uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar16);
    if (uVar14 == 100000) {
      uVar10 = 1;
LAB_001069d8:
      std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base(&local_1898);
      if (local_1840.hashers.
          super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1840.hashers.
                        super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
                (&local_1840.ngram.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
      return (bool)((byte)uVar10 & 1);
    }
  }
  puVar12 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar15 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node;
  puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_last;
  if (local_1898._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      local_18a0 = CONCAT71(local_18a0._1_7_,*puVar12);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_18a0,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      puVar12 = puVar12 + 1;
      if (puVar12 == puVar7) {
        puVar12 = ppuVar15[1];
        ppuVar15 = ppuVar15 + 1;
        puVar7 = puVar12 + 0x200;
      }
    } while (puVar12 != local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bug",3);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  uVar5 = (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_cur -
          (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first;
  if ((long)uVar5 < 0) {
    uVar9 = (long)uVar5 >> 9;
LAB_00106745:
    puVar6 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar9] +
             uVar5 + uVar9 * -0x200;
  }
  else {
    puVar6 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (0x1ff < uVar5) {
      uVar9 = uVar5 >> 9;
      goto LAB_00106745;
    }
  }
  local_18a0._0_1_ = *puVar6;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_18a0,1);
  puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
           (1 - (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
  if ((long)local_1898._M_impl.super__Deque_impl_data._M_start._M_cur -
      (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first < -1) {
    uVar5 = (long)puVar7 >> 9;
LAB_001067b5:
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(puVar7 + uVar5 * -0x200);
  }
  else {
    if ((uchar *)0x1ff < puVar7) {
      uVar5 = (ulong)puVar7 >> 9;
      goto LAB_001067b5;
    }
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  }
  local_18a0._0_1_ = *puVar7;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_18a0,1);
  puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
           (2 - (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
  if ((long)local_1898._M_impl.super__Deque_impl_data._M_start._M_cur -
      (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first < -2) {
    uVar5 = (long)puVar7 >> 9;
LAB_00106820:
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(puVar7 + uVar5 * -0x200);
  }
  else {
    if ((uchar *)0x1ff < puVar7) {
      uVar5 = (ulong)puVar7 >> 9;
      goto LAB_00106820;
    }
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 2;
  }
  local_18a0 = CONCAT71(local_18a0._1_7_,*puVar7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_18a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," was hashed to ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," when true hash value is ",0x19);
  ThreeWiseHash<unsigned_int,unsigned_char>::
  hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
            ((ThreeWiseHash<unsigned_int,unsigned_char> *)&local_1840,
             (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1898);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar13 = 0;
  do {
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
             (lVar13 - (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)puVar7 < 0) {
      uVar5 = (long)puVar7 >> 9;
LAB_0010690b:
      puVar12 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
                (long)(local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
                      (uVar5 * -0x200 -
                      (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first));
    }
    else {
      puVar12 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((uchar *)0x1ff < puVar7) {
        uVar5 = (ulong)puVar7 >> 9;
        goto LAB_0010690b;
      }
    }
    local_18a0 = CONCAT71(local_18a0._1_7_,puVar12[lVar13]);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_18a0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar13 = lVar13 + 1;
    uVar10 = local_1844;
  } while (lVar13 != 3);
  goto LAB_001069d8;
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}